

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Data_Query_R_PDU::Encode(Data_Query_R_PDU *this)

{
  KDataStream *in_RSI;
  
  Encode((Data_Query_R_PDU *)
         &this[-1].super_Data_Query_PDU.super_Simulation_Management_Header.super_Header.
          super_Header6.m_TimeStamp,in_RSI);
  return;
}

Assistant:

void Data_Query_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    Reliability_Header::Encode( stream );

    stream << m_ui32RequestID
           << KDIS_STREAM m_TimeInterval
           << m_ui32NumFixedDatum
           << m_ui32NumVariableDatum;

    vector<KUINT32>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<KUINT32>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        stream << *citrFixed;
    }

    vector<KUINT32>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<KUINT32>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        stream << *citrVar;
    }
}